

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int pmbtoken_pst1_get_h_for_testing(uint8_t *out)

{
  int iVar1;
  size_t sVar2;
  EC_AFFINE h;
  EC_AFFINE EStack_98;
  
  iVar1 = pmbtoken_pst1_init_method();
  if ((iVar1 != 0) &&
     (iVar1 = ec_jacobian_to_affine(pmbtoken_pst1_method.group,&EStack_98,&pmbtoken_pst1_method.h),
     iVar1 != 0)) {
    sVar2 = ec_point_to_bytes(pmbtoken_pst1_method.group,&EStack_98,POINT_CONVERSION_UNCOMPRESSED,
                              out,0x61);
    return (uint)(sVar2 == 0x61);
  }
  return 0;
}

Assistant:

int pmbtoken_pst1_get_h_for_testing(uint8_t out[97]) {
  if (!pmbtoken_pst1_init_method()) {
    return 0;
  }
  EC_AFFINE h;
  return ec_jacobian_to_affine(pmbtoken_pst1_method.group, &h,
                               &pmbtoken_pst1_method.h) &&
         ec_point_to_bytes(pmbtoken_pst1_method.group, &h,
                           POINT_CONVERSION_UNCOMPRESSED, out, 97) == 97;
}